

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::CommitDataRequest::operator==
          (CommitDataRequest *this,CommitDataRequest *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  bool local_19;
  CommitDataRequest *other_local;
  CommitDataRequest *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    bVar2 = ::std::operator==(&this->chunks_to_move_,&other->chunks_to_move_);
    local_19 = false;
    if (bVar2) {
      bVar2 = ::std::operator==(&this->chunks_to_patch_,&other->chunks_to_patch_);
      local_19 = false;
      if (bVar2) {
        local_19 = this->flush_request_id_ == other->flush_request_id_;
      }
    }
  }
  return local_19;
}

Assistant:

bool CommitDataRequest::operator==(const CommitDataRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && chunks_to_move_ == other.chunks_to_move_
   && chunks_to_patch_ == other.chunks_to_patch_
   && flush_request_id_ == other.flush_request_id_;
}